

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void generateCards(card *cards)

{
  pointer pcVar1;
  card *this;
  string *psVar2;
  pointer *__ptr;
  ulong uVar3;
  uint __val;
  char *local_d0;
  uint local_c8;
  char local_c0 [144];
  
  this = (card *)operator_new(0x30);
  card::card(this);
  psVar2 = (string *)&cards->name;
  uVar3 = 0;
  do {
    if (6 < uVar3) {
      this->value = 1;
      (*(code *)(&DAT_00108030 + *(int *)(&DAT_00108030 + (ulong)((int)uVar3 - 7) * 4)))();
      return;
    }
    __val = (int)uVar3 + 1;
    this->value = __val;
    local_d0 = local_c0;
    std::__cxx11::string::_M_construct((ulong)&local_d0,'\x01');
    std::__detail::__to_chars_10_impl<unsigned_int>(local_d0,local_c8,__val);
    std::__cxx11::string::operator=((string *)&this->name,(string *)&local_d0);
    if (local_d0 != local_c0) {
      operator_delete(local_d0);
    }
    *(uint *)(psVar2 + -8) = this->value;
    *(undefined8 *)(psVar2 + -0x10) = *(undefined8 *)this;
    std::__cxx11::string::_M_assign(psVar2);
    uVar3 = uVar3 + 1;
    psVar2 = psVar2 + 0x30;
  } while (uVar3 != 0xb);
  pcVar1 = (this->name)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->name).field_2) {
    operator_delete(pcVar1);
  }
  operator_delete(this);
  return;
}

Assistant:

void generateCards(card cards[]) {
    unique_ptr<card> temp(new card);
    for (unsigned int i = 0; i < CARD_TYPES; i++) {
        // numbered cards 1-7
        if (i < 7) {
            temp->setValue(i + 1);
            temp->setName(to_string(i + 1));
        }
        // special cards
        else {
            temp->setValue(1); // can be used to check if a card is numbered or special
            switch (i) {
                case 7:
                    temp->setName("bolt");
                    temp->setCardType(1);
                    break;
                case 8:
                    temp->setName("mirror");
                    temp->setCardType(2);
                    break;
                case 9:
                    temp->setName("blast");
                    temp->setCardType(3);
                    break;
                case 10:
                    temp->setName("force");
                    temp->setCardType(4);
                    break;
                default:
                    cout << "An error has occurred. " << "cards cannot be generated";
                    break;
            }
        }
        cards[i] = *temp;
    }
}